

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall
Highs::getIntOptionValues
          (Highs *this,string *option,HighsInt *current_value,HighsInt *min_value,
          HighsInt *max_value,HighsInt *default_value)

{
  OptionStatus OVar1;
  
  OVar1 = getLocalOptionValues
                    (&(this->options_).super_HighsOptionsStruct.log_options,option,
                     &(this->options_).records,current_value,min_value,max_value,default_value);
  return -(uint)(OVar1 != kOk);
}

Assistant:

HighsStatus Highs::getIntOptionValues(const std::string& option,
                                      HighsInt* current_value,
                                      HighsInt* min_value, HighsInt* max_value,
                                      HighsInt* default_value) const {
  if (getLocalOptionValues(options_.log_options, option, options_.records,
                           current_value, min_value, max_value,
                           default_value) != OptionStatus::kOk)
    return HighsStatus::kError;
  return HighsStatus::kOk;
}